

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VCFilter>::Inserter::insertOne(Inserter *this,qsizetype pos,VCFilter *t)

{
  VCFilter *pVVar1;
  long lVar2;
  VCFilter *pVVar3;
  long lVar4;
  
  pVVar1 = this->begin;
  lVar4 = this->size;
  pVVar3 = pVVar1 + lVar4;
  this->end = pVVar3;
  this->last = pVVar1 + lVar4 + -1;
  this->where = pVVar1 + pos;
  lVar2 = lVar4 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar2;
  this->sourceCopyAssign = 1;
  if (0 < lVar2) {
    VCFilter::VCFilter(pVVar3,pVVar1 + lVar4 + -1);
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar2 = 0;
      lVar4 = 0;
      do {
        pVVar3 = (VCFilter *)((long)&(this->last->Name).d.d + lVar2);
        VCFilter::operator=(pVVar3,pVVar3 + -1);
        lVar4 = lVar4 + -1;
        lVar2 = lVar2 + -0x448;
      } while (lVar4 != this->move);
    }
    VCFilter::operator=(this->where,t);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar2;
  this->move = 0;
  this->sourceCopyAssign = lVar2;
  VCFilter::VCFilter(pVVar3,t);
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }